

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O3

void duckdb::CorrOperation::Operation<double,double,duckdb::CorrState,duckdb::RegrR2Operation>
               (CorrState *state,double *y,double *x,AggregateBinaryInput *idata)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar5;
  undefined1 auVar4 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  uVar2 = (state->cov_pop).count + 1;
  (state->cov_pop).count = uVar2;
  auVar11._8_4_ = (int)(uVar2 >> 0x20);
  auVar11._0_8_ = uVar2;
  auVar11._12_4_ = 0x45300000;
  dVar3 = (double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0;
  dVar5 = auVar11._8_8_ - 1.9342813113834067e+25;
  dVar1 = *y;
  dVar7 = (state->cov_pop).meanx;
  dVar12 = (state->cov_pop).meany;
  dVar6 = *x - dVar7;
  auVar4._0_8_ = dVar5 + dVar3;
  auVar4._8_8_ = dVar5 + dVar3;
  auVar10._8_8_ = dVar1 - dVar12;
  auVar10._0_8_ = dVar6;
  auVar11 = divpd(auVar10,auVar4);
  dVar12 = auVar11._8_8_ + dVar12;
  (state->cov_pop).meanx = auVar11._0_8_ + dVar7;
  (state->cov_pop).meany = dVar12;
  (state->cov_pop).co_moment = (dVar1 - dVar12) * dVar6 + (state->cov_pop).co_moment;
  uVar2 = (state->dev_pop_x).count + 1;
  (state->dev_pop_x).count = uVar2;
  dVar1 = *x;
  dVar7 = (state->dev_pop_x).mean;
  dVar12 = dVar1 - dVar7;
  auVar8._8_4_ = (int)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._12_4_ = 0x45300000;
  dVar7 = dVar12 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + dVar7;
  (state->dev_pop_x).mean = dVar7;
  (state->dev_pop_x).dsquared = (dVar1 - dVar7) * dVar12 + (state->dev_pop_x).dsquared;
  uVar2 = (state->dev_pop_y).count + 1;
  (state->dev_pop_y).count = uVar2;
  dVar1 = *y;
  dVar7 = (state->dev_pop_y).mean;
  dVar12 = dVar1 - dVar7;
  auVar9._8_4_ = (int)(uVar2 >> 0x20);
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = 0x45300000;
  dVar7 = dVar12 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + dVar7;
  (state->dev_pop_y).mean = dVar7;
  (state->dev_pop_y).dsquared = (dVar1 - dVar7) * dVar12 + (state->dev_pop_y).dsquared;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &y, const B_TYPE &x, AggregateBinaryInput &idata) {
		// update running mean and d^2
		const double n = static_cast<double>(++(state.count));

		const double dx = (x - state.meanx);
		const double meanx = state.meanx + dx / n;

		const double dy = (y - state.meany);
		const double meany = state.meany + dy / n;

		//  Schubert and Gertz SSDBM 2018 (4.3)
		const double C = state.co_moment + dx * (y - meany);

		state.meanx = meanx;
		state.meany = meany;
		state.co_moment = C;
	}